

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O2

QString * QtPrivate::QStringList_join
                    (QString *__return_storage_ptr__,QStringList *that,QChar *sep,qsizetype seplen)

{
  qsizetype asize;
  long lVar1;
  qsizetype qVar2;
  bool bVar3;
  
  asize = accumulatedSize(that,seplen);
  qVar2 = (that->d).size;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (asize != 0) {
    QString::reserve(__return_storage_ptr__,asize);
    lVar1 = 0;
    while (bVar3 = qVar2 != 0, qVar2 = qVar2 + -1, bVar3) {
      if (lVar1 != 0) {
        QString::append(__return_storage_ptr__,sep,seplen);
      }
      QString::append(__return_storage_ptr__,(QString *)((long)&(((that->d).ptr)->d).d + lVar1));
      lVar1 = lVar1 + 0x18;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QtPrivate::QStringList_join(const QStringList *that, const QChar *sep, qsizetype seplen)
{
    const qsizetype totalLength = accumulatedSize(*that, seplen);
    const qsizetype size = that->size();

    QString res;
    if (totalLength == 0)
        return res;
    res.reserve(totalLength);
    for (qsizetype i = 0; i < size; ++i) {
        if (i)
            res.append(sep, seplen);
        res += that->at(i);
    }
    return res;
}